

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::HierarchicalValueExpression::HierarchicalValueExpression
          (HierarchicalValueExpression *this,Scope *scope,ValueSymbol *symbol,
          HierarchicalReference *ref,SourceRange sourceRange)

{
  Expression *pEVar1;
  pointer pEVar2;
  size_t sVar3;
  bool bVar4;
  
  ValueExpressionBase::ValueExpressionBase
            (&this->super_ValueExpressionBase,HierarchicalValue,symbol,sourceRange);
  pEVar1 = ref->expr;
  pEVar2 = (ref->path)._M_ptr;
  sVar3 = (ref->path)._M_extent._M_extent_value;
  (this->ref).target = ref->target;
  (this->ref).expr = pEVar1;
  (this->ref).upwardCount = ref->upwardCount;
  (this->ref).path._M_ptr = pEVar2;
  (this->ref).path._M_extent._M_extent_value = sVar3;
  (this->ref).expr = (Expression *)this;
  bVar4 = HierarchicalReference::isUpward(&this->ref);
  if (bVar4) {
    Compilation::noteUpwardReference(scope->compilation,scope,&this->ref);
    return;
  }
  return;
}

Assistant:

HierarchicalValueExpression::HierarchicalValueExpression(const Scope& scope,
                                                         const ValueSymbol& symbol,
                                                         const HierarchicalReference& ref,
                                                         SourceRange sourceRange) :
    ValueExpressionBase(ExpressionKind::HierarchicalValue, symbol, sourceRange), ref(ref) {
    SLANG_ASSERT(ref.target == &symbol);
    this->ref.expr = this;

    if (this->ref.isUpward())
        scope.getCompilation().noteUpwardReference(scope, this->ref);
}